

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::anon_unknown_5::AESRecordNumberEncrypter::GenerateMask
          (AESRecordNumberEncrypter *this,Span<unsigned_char> out,Span<const_unsigned_char> sample)

{
  size_t sVar1;
  uchar *puVar2;
  uchar local_48 [8];
  uint8_t mask [16];
  AESRecordNumberEncrypter *this_local;
  Span<const_unsigned_char> sample_local;
  Span<unsigned_char> out_local;
  
  sample_local.size_ = (size_t)out.data_;
  sample_local.data_ = (uchar *)sample.size_;
  this_local = (AESRecordNumberEncrypter *)sample.data_;
  mask._8_8_ = this;
  sVar1 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
  if ((0xf < sVar1) &&
     (sVar1 = Span<unsigned_char>::size((Span<unsigned_char> *)&sample_local.size_), sVar1 < 0x11))
  {
    puVar2 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
    AES_encrypt(puVar2,local_48,(AES_KEY *)&this->key_);
    puVar2 = Span<unsigned_char>::data((Span<unsigned_char> *)&sample_local.size_);
    sVar1 = Span<unsigned_char>::size((Span<unsigned_char> *)&sample_local.size_);
    ::OPENSSL_memcpy(puVar2,local_48,sVar1);
    return true;
  }
  return false;
}

Assistant:

bool GenerateMask(Span<uint8_t> out, Span<const uint8_t> sample) override {
    if (sample.size() < AES_BLOCK_SIZE || out.size() > AES_BLOCK_SIZE) {
      return false;
    }
    uint8_t mask[AES_BLOCK_SIZE];
    AES_encrypt(sample.data(), mask, &key_);
    OPENSSL_memcpy(out.data(), mask, out.size());
    return true;
  }